

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O2

void __thiscall RasterizerA2::clear(RasterizerA2 *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Bounds *pBVar4;
  size_t sVar5;
  Cell *pCVar6;
  ulong uVar7;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar7 = (ulong)(this->_yBounds).start;
    iVar1 = (this->_yBounds).end;
    sVar5 = this->_cellStride;
    pCVar6 = this->_cells + sVar5 * uVar7;
    for (; uVar7 <= (ulong)(long)iVar1; uVar7 = uVar7 + 1) {
      iVar2 = this->_xBounds[uVar7].start;
      iVar3 = this->_xBounds[uVar7].end;
      if (iVar2 <= iVar3) {
        memset(pCVar6 + iVar2,0,(long)((iVar3 - iVar2) + 1) << 3);
        pBVar4 = this->_xBounds;
        pBVar4[uVar7].start = 0x7fffffff;
        pBVar4[uVar7].end = 0;
        sVar5 = this->_cellStride;
      }
      pCVar6 = pCVar6 + sVar5;
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }